

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_parser.c
# Opt level: O0

yajl_status yajl_do_parse(yajl_handle hand,uchar *jsonText,size_t jsonTextLen)

{
  code *pcVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  size_t *psVar5;
  uchar *puVar6;
  size_t sVar7;
  longlong lVar8;
  int *piVar9;
  undefined8 uVar10;
  size_t in_RDX;
  uchar *in_RSI;
  yajl_lexer in_RDI;
  double dVar11;
  yajl_state s;
  double d;
  longlong i;
  yajl_state stateToPush;
  size_t *offset;
  size_t bufLen;
  uchar *buf;
  yajl_tok tok;
  void *in_stack_ffffffffffffff58;
  yajl_buf in_stack_ffffffffffffff60;
  ulong in_stack_ffffffffffffff70;
  uchar *in_stack_ffffffffffffff78;
  ulong in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  size_t *in_stack_ffffffffffffffc8;
  uchar **in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  yajl_tok in_stack_ffffffffffffffdc;
  
  psVar5 = &in_RDI->bufOff;
  *psVar5 = 0;
LAB_00105dec:
  do {
    puVar6 = (uchar *)(ulong)*(byte *)((in_RDI[1].lineOff - 1) + *(long *)&in_RDI->validateUTF8);
    switch(puVar6) {
    case (uchar *)0x0:
    case (uchar *)0x6:
    case (uchar *)0x9:
    case (uchar *)0xb:
    case (uchar *)0xc:
      cVar3 = '\0';
      in_stack_ffffffffffffffdc =
           yajl_lex_lex(in_RDI,in_RSI,in_RDX,
                        (size_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      in_stack_ffffffffffffff90 = (ulong)in_stack_ffffffffffffffdc;
      switch(in_stack_ffffffffffffff90) {
      case 0:
        if (((in_RDI->lineOff != 0) && (*(long *)(in_RDI->lineOff + 8) != 0)) &&
           (iVar4 = (**(code **)(in_RDI->lineOff + 8))
                              (in_RDI->charOff,*(uchar *)in_stack_ffffffffffffffd0 == 't'),
           iVar4 == 0)) {
          *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
          in_RDI->buf = (yajl_buf)"client cancelled parse via callback return value";
          return yajl_status_client_canceled;
        }
        break;
      case 1:
      case 2:
      case 9:
        goto switchD_00105f86_caseD_1;
      case 3:
        return yajl_status_ok;
      case 4:
        *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 3;
        goto LAB_00105dec;
      case 5:
        if (((in_RDI->lineOff != 0) && (*(long *)(in_RDI->lineOff + 0x48) != 0)) &&
           (iVar4 = (**(code **)(in_RDI->lineOff + 0x48))(in_RDI->charOff), iVar4 == 0)) {
          *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
          in_RDI->buf = (yajl_buf)"client cancelled parse via callback return value";
          return yajl_status_client_canceled;
        }
        cVar3 = '\t';
        break;
      case 6:
        if (((in_RDI->lineOff != 0) && (*(long *)(in_RDI->lineOff + 0x30) != 0)) &&
           (iVar4 = (**(code **)(in_RDI->lineOff + 0x30))(in_RDI->charOff), iVar4 == 0)) {
          *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
          in_RDI->buf = (yajl_buf)"client cancelled parse via callback return value";
          return yajl_status_client_canceled;
        }
        cVar3 = '\x04';
        break;
      case 7:
        if (((in_RDI->lineOff != 0) && (*(long *)in_RDI->lineOff != 0)) &&
           (iVar4 = (**(code **)in_RDI->lineOff)(in_RDI->charOff), iVar4 == 0)) {
          *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
          in_RDI->buf = (yajl_buf)"client cancelled parse via callback return value";
          return yajl_status_client_canceled;
        }
        break;
      case 8:
        if (*(char *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) == '\t') {
          if (((in_RDI->lineOff != 0) && (*(long *)(in_RDI->lineOff + 0x50) != 0)) &&
             (iVar4 = (**(code **)(in_RDI->lineOff + 0x50))(in_RDI->charOff), iVar4 == 0)) {
            *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
            in_RDI->buf = (yajl_buf)"client cancelled parse via callback return value";
            return yajl_status_client_canceled;
          }
          in_RDI[1].lineOff = in_RDI[1].lineOff - 1;
        }
        else {
switchD_00105f86_caseD_1:
          *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
          in_RDI->buf = (yajl_buf)"unallowed token at this point in JSON text";
        }
        goto LAB_00105dec;
      case 10:
        if (in_RDI->lineOff != 0) {
          if (*(long *)(in_RDI->lineOff + 0x20) == 0) {
            if (*(long *)(in_RDI->lineOff + 0x10) != 0) {
              piVar9 = __errno_location();
              *piVar9 = 0;
              lVar8 = yajl_parse_integer(in_stack_ffffffffffffff78,
                                         (uint)(in_stack_ffffffffffffff70 >> 0x20));
              if (((lVar8 == -0x8000000000000000) || (lVar8 == 0x7fffffffffffffff)) &&
                 (piVar9 = __errno_location(), *piVar9 == 0x22)) {
                *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
                in_RDI->buf = (yajl_buf)"integer overflow";
                if ((size_t *)*psVar5 < in_stack_ffffffffffffffc8) {
                  *psVar5 = 0;
                }
                else {
                  *psVar5 = *psVar5 - (long)in_stack_ffffffffffffffc8;
                }
                goto LAB_00105dec;
              }
              iVar4 = (**(code **)(in_RDI->lineOff + 0x10))(in_RDI->charOff,lVar8);
              if (iVar4 == 0) {
                *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
                in_RDI->buf = (yajl_buf)"client cancelled parse via callback return value";
                return yajl_status_client_canceled;
              }
            }
          }
          else {
            iVar4 = (**(code **)(in_RDI->lineOff + 0x20))
                              (in_RDI->charOff,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
            if (iVar4 == 0) {
              *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
              in_RDI->buf = (yajl_buf)"client cancelled parse via callback return value";
              return yajl_status_client_canceled;
            }
          }
        }
        break;
      case 0xb:
        if (in_RDI->lineOff != 0) {
          if (*(long *)(in_RDI->lineOff + 0x20) == 0) {
            if (*(long *)(in_RDI->lineOff + 0x18) != 0) {
              yajl_buf_clear(*(yajl_buf *)&in_RDI->bufInUse);
              yajl_buf_append(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x106674);
              in_stack_ffffffffffffffd0 = (uchar **)yajl_buf_data(*(yajl_buf *)&in_RDI->bufInUse);
              piVar9 = __errno_location();
              *piVar9 = 0;
              dVar11 = strtod((char *)in_stack_ffffffffffffffd0,(char **)0x0);
              if ((((dVar11 == INFINITY) && (!NAN(dVar11))) ||
                  ((dVar11 == -INFINITY && (!NAN(dVar11))))) &&
                 (piVar9 = __errno_location(), *piVar9 == 0x22)) {
                *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
                in_RDI->buf = (yajl_buf)"numeric (floating point) overflow";
                if ((size_t *)*psVar5 < in_stack_ffffffffffffffc8) {
                  *psVar5 = 0;
                }
                else {
                  *psVar5 = *psVar5 - (long)in_stack_ffffffffffffffc8;
                }
                goto LAB_00105dec;
              }
              iVar4 = (**(code **)(in_RDI->lineOff + 0x18))(dVar11,in_RDI->charOff);
              if (iVar4 == 0) {
                *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
                in_RDI->buf = (yajl_buf)"client cancelled parse via callback return value";
                return yajl_status_client_canceled;
              }
            }
          }
          else {
            iVar4 = (**(code **)(in_RDI->lineOff + 0x20))
                              (in_RDI->charOff,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
            if (iVar4 == 0) {
              *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
              in_RDI->buf = (yajl_buf)"client cancelled parse via callback return value";
              return yajl_status_client_canceled;
            }
          }
        }
        break;
      case 0xc:
        if (((in_RDI->lineOff != 0) && (*(long *)(in_RDI->lineOff + 0x28) != 0)) &&
           (iVar4 = (**(code **)(in_RDI->lineOff + 0x28))
                              (in_RDI->charOff,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8),
           iVar4 == 0)) {
          *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
          in_RDI->buf = (yajl_buf)"client cancelled parse via callback return value";
          return yajl_status_client_canceled;
        }
        break;
      case 0xd:
        if ((in_RDI->lineOff != 0) && (*(long *)(in_RDI->lineOff + 0x28) != 0)) {
          yajl_buf_clear(*(yajl_buf *)&in_RDI->bufInUse);
          yajl_string_decode((yajl_buf)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                             ,puVar6,in_stack_ffffffffffffff90);
          pcVar1 = *(code **)(in_RDI->lineOff + 0x28);
          in_stack_ffffffffffffff78 = (uchar *)in_RDI->charOff;
          puVar6 = yajl_buf_data(*(yajl_buf *)&in_RDI->bufInUse);
          sVar7 = yajl_buf_len(*(yajl_buf *)&in_RDI->bufInUse);
          iVar4 = (*pcVar1)(in_stack_ffffffffffffff78,puVar6,sVar7);
          if (iVar4 == 0) {
            *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
            in_RDI->buf = (yajl_buf)"client cancelled parse via callback return value";
            return yajl_status_client_canceled;
          }
        }
        break;
      default:
        *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
        in_RDI->buf = (yajl_buf)"invalid token, internal error";
        goto LAB_00105dec;
      }
      in_stack_ffffffffffffffa4 =
           (uint)*(byte *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1));
      if ((in_stack_ffffffffffffffa4 == 0) || (in_stack_ffffffffffffffa4 == 0xc)) {
        *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 1;
      }
      else if (in_stack_ffffffffffffffa4 == 6) {
        *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 7;
      }
      else {
        *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 10;
      }
      if (cVar3 != '\0') {
        if (in_RDI->alloc == (yajl_alloc_funcs *)in_RDI[1].lineOff) {
          in_RDI->alloc = in_RDI->alloc + 4;
          uVar10 = (**(code **)(in_RDI[1].charOff + 8))
                             (*(undefined8 *)(in_RDI[1].charOff + 0x18),
                              *(undefined8 *)&in_RDI->validateUTF8,in_RDI->alloc);
          *(undefined8 *)&in_RDI->validateUTF8 = uVar10;
        }
        lVar2 = *(long *)&in_RDI->validateUTF8;
        sVar7 = in_RDI[1].lineOff;
        in_RDI[1].lineOff = sVar7 + 1;
        *(char *)(lVar2 + sVar7) = cVar3;
      }
      break;
    case (uchar *)0x1:
      if ((in_RDI[1].validateUTF8 & 8) == 0) {
        if (((in_RDI[1].validateUTF8 & 4) != 0) || (*psVar5 == in_RDX)) {
          return yajl_status_ok;
        }
        in_stack_ffffffffffffffdc =
             yajl_lex_lex(in_RDI,in_RSI,in_RDX,
                          (size_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        if (in_stack_ffffffffffffffdc != yajl_tok_eof) {
          *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
          in_RDI->buf = (yajl_buf)"trailing garbage";
        }
      }
      else {
        *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 0xc;
      }
      break;
    case (uchar *)0x2:
    case (uchar *)0x3:
      return yajl_status_error;
    case (uchar *)0x4:
    case (uchar *)0x8:
      in_stack_ffffffffffffffdc =
           yajl_lex_lex(in_RDI,in_RSI,in_RDX,
                        (size_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      in_stack_ffffffffffffff70 = (ulong)(in_stack_ffffffffffffffdc - yajl_tok_eof);
      switch(in_stack_ffffffffffffff70) {
      case 0:
        return yajl_status_ok;
      case 1:
        *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 3;
        break;
      case 6:
        if (*(char *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) == '\x04') {
          if (((in_RDI->lineOff != 0) && (*(long *)(in_RDI->lineOff + 0x40) != 0)) &&
             (iVar4 = (**(code **)(in_RDI->lineOff + 0x40))(in_RDI->charOff), iVar4 == 0)) {
            *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
            in_RDI->buf = (yajl_buf)"client cancelled parse via callback return value";
            return yajl_status_client_canceled;
          }
          in_RDI[1].lineOff = in_RDI[1].lineOff - 1;
          break;
        }
      default:
        *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
        in_RDI->buf = (yajl_buf)"invalid object key (must be a string)";
        break;
      case 10:
        if ((in_RDI->lineOff != 0) && (*(long *)(in_RDI->lineOff + 0x38) != 0)) {
          yajl_buf_clear(*(yajl_buf *)&in_RDI->bufInUse);
          yajl_string_decode((yajl_buf)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                             ,puVar6,in_stack_ffffffffffffff90);
          in_stack_ffffffffffffffd0 = (uchar **)yajl_buf_data(*(yajl_buf *)&in_RDI->bufInUse);
          in_stack_ffffffffffffffc8 = (size_t *)yajl_buf_len(*(yajl_buf *)&in_RDI->bufInUse);
        }
      case 9:
        if (((in_RDI->lineOff != 0) && (*(long *)(in_RDI->lineOff + 0x38) != 0)) &&
           (iVar4 = (**(code **)(in_RDI->lineOff + 0x38))
                              (in_RDI->charOff,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8),
           iVar4 == 0)) {
          *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
          in_RDI->buf = (yajl_buf)"client cancelled parse via callback return value";
          return yajl_status_client_canceled;
        }
        *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 5;
      }
      break;
    case (uchar *)0x5:
      in_stack_ffffffffffffffdc =
           yajl_lex_lex(in_RDI,in_RSI,in_RDX,
                        (size_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      if (in_stack_ffffffffffffffdc == yajl_tok_colon) {
        *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 6;
      }
      else {
        if (in_stack_ffffffffffffffdc == yajl_tok_eof) {
          return yajl_status_ok;
        }
        if (in_stack_ffffffffffffffdc == yajl_tok_error) {
          *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 3;
        }
        else {
          *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
          in_RDI->buf = (yajl_buf)"object key and value must be separated by a colon (\':\')";
        }
      }
      break;
    case (uchar *)0x7:
      in_stack_ffffffffffffffdc =
           yajl_lex_lex(in_RDI,in_RSI,in_RDX,
                        (size_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      in_stack_ffffffffffffff60 = (yajl_buf)(ulong)(in_stack_ffffffffffffffdc - yajl_tok_comma);
      switch(in_stack_ffffffffffffff60) {
      case (yajl_buf)0x0:
        *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 8;
        break;
      case (yajl_buf)0x1:
        return yajl_status_ok;
      case (yajl_buf)0x2:
        *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 3;
        break;
      default:
        *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
        in_RDI->buf = (yajl_buf)"after key and value, inside map, I expect \',\' or \'}\'";
        if ((size_t *)*psVar5 < in_stack_ffffffffffffffc8) {
          *psVar5 = 0;
        }
        else {
          *psVar5 = *psVar5 - (long)in_stack_ffffffffffffffc8;
        }
        break;
      case (yajl_buf)0x7:
        if (((in_RDI->lineOff != 0) && (*(long *)(in_RDI->lineOff + 0x40) != 0)) &&
           (iVar4 = (**(code **)(in_RDI->lineOff + 0x40))(in_RDI->charOff), iVar4 == 0)) {
          *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
          in_RDI->buf = (yajl_buf)"client cancelled parse via callback return value";
          return yajl_status_client_canceled;
        }
        in_RDI[1].lineOff = in_RDI[1].lineOff - 1;
      }
      break;
    case (uchar *)0xa:
      goto switchD_00105e23_caseD_a;
    default:
      abort();
    }
  } while( true );
switchD_00105e23_caseD_a:
  in_stack_ffffffffffffffdc =
       yajl_lex_lex(in_RDI,in_RSI,in_RDX,
                    (size_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  in_stack_ffffffffffffff58 = (void *)(ulong)(in_stack_ffffffffffffffdc - yajl_tok_comma);
  switch(in_stack_ffffffffffffff58) {
  case (void *)0x0:
    *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 0xb;
    break;
  case (void *)0x1:
    return yajl_status_ok;
  case (void *)0x2:
    *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 3;
    break;
  default:
    *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
    in_RDI->buf = (yajl_buf)"after array element, I expect \',\' or \']\'";
    break;
  case (void *)0x6:
    if (((in_RDI->lineOff != 0) && (*(long *)(in_RDI->lineOff + 0x50) != 0)) &&
       (iVar4 = (**(code **)(in_RDI->lineOff + 0x50))(in_RDI->charOff), iVar4 == 0)) {
      *(undefined1 *)(*(long *)&in_RDI->validateUTF8 + (in_RDI[1].lineOff - 1)) = 2;
      in_RDI->buf = (yajl_buf)"client cancelled parse via callback return value";
      return yajl_status_client_canceled;
    }
    in_RDI[1].lineOff = in_RDI[1].lineOff - 1;
  }
  goto LAB_00105dec;
}

Assistant:

yajl_status
yajl_do_parse(yajl_handle hand, const unsigned char * jsonText,
              size_t jsonTextLen)
{
    yajl_tok tok;
    const unsigned char * buf;
    size_t bufLen;
    size_t * offset = &(hand->bytesConsumed);

    *offset = 0;

  around_again:
    switch (yajl_bs_current(hand->stateStack)) {
        case yajl_state_parse_complete:
            if (hand->flags & yajl_allow_multiple_values) {
                yajl_bs_set(hand->stateStack, yajl_state_got_value);
                goto around_again;
            }
            if (!(hand->flags & yajl_allow_trailing_garbage)) {
                if (*offset != jsonTextLen) {
                    tok = yajl_lex_lex(hand->lexer, jsonText, jsonTextLen,
                                       offset, &buf, &bufLen);
                    if (tok != yajl_tok_eof) {
                        yajl_bs_set(hand->stateStack, yajl_state_parse_error);
                        hand->parseError = "trailing garbage";
                    }
                    goto around_again;
                }
            }
            return yajl_status_ok;
        case yajl_state_lexical_error:
        case yajl_state_parse_error:
            return yajl_status_error;
        case yajl_state_start:
        case yajl_state_got_value:
        case yajl_state_map_need_val:
        case yajl_state_array_need_val:
        case yajl_state_array_start:  {
            /* for arrays and maps, we advance the state for this
             * depth, then push the state of the next depth.
             * If an error occurs during the parsing of the nesting
             * enitity, the state at this level will not matter.
             * a state that needs pushing will be anything other
             * than state_start */

            yajl_state stateToPush = yajl_state_start;

            tok = yajl_lex_lex(hand->lexer, jsonText, jsonTextLen,
                               offset, &buf, &bufLen);

            switch (tok) {
                case yajl_tok_eof:
                    return yajl_status_ok;
                case yajl_tok_error:
                    yajl_bs_set(hand->stateStack, yajl_state_lexical_error);
                    goto around_again;
                case yajl_tok_string:
                    if (hand->callbacks && hand->callbacks->yajl_string) {
                        _CC_CHK(hand->callbacks->yajl_string(hand->ctx,
                                                             buf, bufLen));
                    }
                    break;
                case yajl_tok_string_with_escapes:
                    if (hand->callbacks && hand->callbacks->yajl_string) {
                        yajl_buf_clear(hand->decodeBuf);
                        yajl_string_decode(hand->decodeBuf, buf, bufLen);
                        _CC_CHK(hand->callbacks->yajl_string(
                                    hand->ctx, yajl_buf_data(hand->decodeBuf),
                                    yajl_buf_len(hand->decodeBuf)));
                    }
                    break;
                case yajl_tok_bool:
                    if (hand->callbacks && hand->callbacks->yajl_boolean) {
                        _CC_CHK(hand->callbacks->yajl_boolean(hand->ctx,
                                                              *buf == 't'));
                    }
                    break;
                case yajl_tok_null:
                    if (hand->callbacks && hand->callbacks->yajl_null) {
                        _CC_CHK(hand->callbacks->yajl_null(hand->ctx));
                    }
                    break;
                case yajl_tok_left_bracket:
                    if (hand->callbacks && hand->callbacks->yajl_start_map) {
                        _CC_CHK(hand->callbacks->yajl_start_map(hand->ctx));
                    }
                    stateToPush = yajl_state_map_start;
                    break;
                case yajl_tok_left_brace:
                    if (hand->callbacks && hand->callbacks->yajl_start_array) {
                        _CC_CHK(hand->callbacks->yajl_start_array(hand->ctx));
                    }
                    stateToPush = yajl_state_array_start;
                    break;
                case yajl_tok_integer:
                    if (hand->callbacks) {
                        if (hand->callbacks->yajl_number) {
                            _CC_CHK(hand->callbacks->yajl_number(
                                        hand->ctx,(const char *) buf, bufLen));
                        } else if (hand->callbacks->yajl_integer) {
                            long long int i = 0;
                            errno = 0;
                            i = yajl_parse_integer(buf, bufLen);
                            if ((i == LLONG_MIN || i == LLONG_MAX) &&
                                errno == ERANGE)
                            {
                                yajl_bs_set(hand->stateStack,
                                            yajl_state_parse_error);
                                hand->parseError = "integer overflow" ;
                                /* try to restore error offset */
                                if (*offset >= bufLen) *offset -= bufLen;
                                else *offset = 0;
                                goto around_again;
                            }
                            _CC_CHK(hand->callbacks->yajl_integer(hand->ctx,
                                                                  i));
                        }
                    }
                    break;
                case yajl_tok_double:
                    if (hand->callbacks) {
                        if (hand->callbacks->yajl_number) {
                            _CC_CHK(hand->callbacks->yajl_number(
                                        hand->ctx, (const char *) buf, bufLen));
                        } else if (hand->callbacks->yajl_double) {
                            double d = 0.0;
                            yajl_buf_clear(hand->decodeBuf);
                            yajl_buf_append(hand->decodeBuf, buf, bufLen);
                            buf = yajl_buf_data(hand->decodeBuf);
                            errno = 0;
                            d = strtod((const char *) buf, NULL);
                            if ((d == HUGE_VAL || d == -HUGE_VAL) &&
                                errno == ERANGE)
                            {
                                yajl_bs_set(hand->stateStack,
                                            yajl_state_parse_error);
                                hand->parseError = "numeric (floating point) "
                                    "overflow";
                                /* try to restore error offset */
                                if (*offset >= bufLen) *offset -= bufLen;
                                else *offset = 0;
                                goto around_again;
                            }
                            _CC_CHK(hand->callbacks->yajl_double(hand->ctx,
                                                                 d));
                        }
                    }
                    break;
                case yajl_tok_right_brace: {
                    if (yajl_bs_current(hand->stateStack) ==
                        yajl_state_array_start)
                    {
                        if (hand->callbacks &&
                            hand->callbacks->yajl_end_array)
                        {
                            _CC_CHK(hand->callbacks->yajl_end_array(hand->ctx));
                        }
                        yajl_bs_pop(hand->stateStack);
                        goto around_again;
                    }
                    /* intentional fall-through */
                }
                case yajl_tok_colon:
                case yajl_tok_comma:
                case yajl_tok_right_bracket:
                    yajl_bs_set(hand->stateStack, yajl_state_parse_error);
                    hand->parseError =
                        "unallowed token at this point in JSON text";
                    goto around_again;
                default:
                    yajl_bs_set(hand->stateStack, yajl_state_parse_error);
                    hand->parseError = "invalid token, internal error";
                    goto around_again;
            }
            /* got a value.  transition depends on the state we're in. */
            {
                yajl_state s = yajl_bs_current(hand->stateStack);
                if (s == yajl_state_start || s == yajl_state_got_value) {
                    yajl_bs_set(hand->stateStack, yajl_state_parse_complete);
                } else if (s == yajl_state_map_need_val) {
                    yajl_bs_set(hand->stateStack, yajl_state_map_got_val);
                } else {
                    yajl_bs_set(hand->stateStack, yajl_state_array_got_val);
                }
            }
            if (stateToPush != yajl_state_start) {
                yajl_bs_push(hand->stateStack, stateToPush);
            }

            goto around_again;
        }
        case yajl_state_map_start:
        case yajl_state_map_need_key: {
            /* only difference between these two states is that in
             * start '}' is valid, whereas in need_key, we've parsed
             * a comma, and a string key _must_ follow */
            tok = yajl_lex_lex(hand->lexer, jsonText, jsonTextLen,
                               offset, &buf, &bufLen);
            switch (tok) {
                case yajl_tok_eof:
                    return yajl_status_ok;
                case yajl_tok_error:
                    yajl_bs_set(hand->stateStack, yajl_state_lexical_error);
                    goto around_again;
                case yajl_tok_string_with_escapes:
                    if (hand->callbacks && hand->callbacks->yajl_map_key) {
                        yajl_buf_clear(hand->decodeBuf);
                        yajl_string_decode(hand->decodeBuf, buf, bufLen);
                        buf = yajl_buf_data(hand->decodeBuf);
                        bufLen = yajl_buf_len(hand->decodeBuf);
                    }
                    /* intentional fall-through */
                case yajl_tok_string:
                    if (hand->callbacks && hand->callbacks->yajl_map_key) {
                        _CC_CHK(hand->callbacks->yajl_map_key(hand->ctx, buf,
                                                              bufLen));
                    }
                    yajl_bs_set(hand->stateStack, yajl_state_map_sep);
                    goto around_again;
                case yajl_tok_right_bracket:
                    if (yajl_bs_current(hand->stateStack) ==
                        yajl_state_map_start)
                    {
                        if (hand->callbacks && hand->callbacks->yajl_end_map) {
                            _CC_CHK(hand->callbacks->yajl_end_map(hand->ctx));
                        }
                        yajl_bs_pop(hand->stateStack);
                        goto around_again;
                    }
                default:
                    yajl_bs_set(hand->stateStack, yajl_state_parse_error);
                    hand->parseError =
                        "invalid object key (must be a string)"; 
                    goto around_again;
            }
        }
        case yajl_state_map_sep: {
            tok = yajl_lex_lex(hand->lexer, jsonText, jsonTextLen,
                               offset, &buf, &bufLen);
            switch (tok) {
                case yajl_tok_colon:
                    yajl_bs_set(hand->stateStack, yajl_state_map_need_val);
                    goto around_again;
                case yajl_tok_eof:
                    return yajl_status_ok;
                case yajl_tok_error:
                    yajl_bs_set(hand->stateStack, yajl_state_lexical_error);
                    goto around_again;
                default:
                    yajl_bs_set(hand->stateStack, yajl_state_parse_error);
                    hand->parseError = "object key and value must "
                        "be separated by a colon (':')";
                    goto around_again;
            }
        }
        case yajl_state_map_got_val: {
            tok = yajl_lex_lex(hand->lexer, jsonText, jsonTextLen,
                               offset, &buf, &bufLen);
            switch (tok) {
                case yajl_tok_right_bracket:
                    if (hand->callbacks && hand->callbacks->yajl_end_map) {
                        _CC_CHK(hand->callbacks->yajl_end_map(hand->ctx));
                    }
                    yajl_bs_pop(hand->stateStack);
                    goto around_again;
                case yajl_tok_comma:
                    yajl_bs_set(hand->stateStack, yajl_state_map_need_key);
                    goto around_again;
                case yajl_tok_eof:
                    return yajl_status_ok;
                case yajl_tok_error:
                    yajl_bs_set(hand->stateStack, yajl_state_lexical_error);
                    goto around_again;
                default:
                    yajl_bs_set(hand->stateStack, yajl_state_parse_error);
                    hand->parseError = "after key and value, inside map, "
                                       "I expect ',' or '}'";
                    /* try to restore error offset */
                    if (*offset >= bufLen) *offset -= bufLen;
                    else *offset = 0;
                    goto around_again;
            }
        }
        case yajl_state_array_got_val: {
            tok = yajl_lex_lex(hand->lexer, jsonText, jsonTextLen,
                               offset, &buf, &bufLen);
            switch (tok) {
                case yajl_tok_right_brace:
                    if (hand->callbacks && hand->callbacks->yajl_end_array) {
                        _CC_CHK(hand->callbacks->yajl_end_array(hand->ctx));
                    }
                    yajl_bs_pop(hand->stateStack);
                    goto around_again;
                case yajl_tok_comma:
                    yajl_bs_set(hand->stateStack, yajl_state_array_need_val);
                    goto around_again;
                case yajl_tok_eof:
                    return yajl_status_ok;
                case yajl_tok_error:
                    yajl_bs_set(hand->stateStack, yajl_state_lexical_error);
                    goto around_again;
                default:
                    yajl_bs_set(hand->stateStack, yajl_state_parse_error);
                    hand->parseError =
                        "after array element, I expect ',' or ']'";
                    goto around_again;
            }
        }
        default:
            break;
    }

    abort();
    return yajl_status_error;
}